

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.h
# Opt level: O3

int mdns::openSocket(void)

{
  int __fd;
  int iVar1;
  char *__s;
  uint32_t val;
  group_req mgroup;
  undefined4 local_b4;
  undefined1 local_b0 [8];
  char acStack_a8 [16];
  sockaddr local_98 [8];
  
  __fd = socket(2,2,0);
  if (__fd < 0) {
    perror("Creating socket failed");
  }
  else {
    local_b4 = 1;
    iVar1 = setsockopt(__fd,1,6,&local_b4,4);
    if (iVar1 < 0) {
      __s = "Setting SO_BROADCAST failed";
    }
    else {
      iVar1 = setsockopt(__fd,1,2,&local_b4,4);
      if (iVar1 < 0) {
        __s = "Setting SO_REUSEADDR failed";
      }
      else {
        iVar1 = setsockopt(__fd,0,0x21,&openSocket::MdnsTTL,4);
        if (iVar1 < 0) {
          __s = "Setting ttl failed";
        }
        else {
          acStack_a8[0] = '\0';
          acStack_a8[1] = '\0';
          acStack_a8[2] = '\0';
          acStack_a8[3] = '\0';
          acStack_a8[4] = '\0';
          acStack_a8[5] = '\0';
          acStack_a8[6] = '\0';
          acStack_a8[7] = '\0';
          local_b0._0_2_ = 2;
          local_b0[2] = '\x14';
          local_b0[3] = -0x17;
          local_b0[4] = '\0';
          local_b0[5] = '\0';
          local_b0[6] = '\0';
          local_b0[7] = '\0';
          iVar1 = bind(__fd,(sockaddr *)local_b0,0x10);
          if (iVar1 < 0) {
            __s = "Falied to bind";
          }
          else {
            memset(acStack_a8 + 8,0,0x88);
            inet_aton("224.0.0.251",(in_addr *)(local_b0 + 4));
            local_98[0].sa_family = local_b0._0_2_;
            local_98[0].sa_data[0] = local_b0[2];
            local_98[0].sa_data[1] = local_b0[3];
            local_98[0].sa_data[2] = local_b0[4];
            local_98[0].sa_data[3] = local_b0[5];
            local_98[0].sa_data[4] = local_b0[6];
            local_98[0].sa_data[5] = local_b0[7];
            local_98[0].sa_data[6] = acStack_a8[0];
            local_98[0].sa_data[7] = acStack_a8[1];
            local_98[0].sa_data[8] = acStack_a8[2];
            local_98[0].sa_data[9] = acStack_a8[3];
            local_98[0].sa_data[10] = acStack_a8[4];
            local_98[0].sa_data[0xb] = acStack_a8[5];
            local_98[0].sa_data[0xc] = acStack_a8[6];
            local_98[0].sa_data[0xd] = acStack_a8[7];
            iVar1 = setsockopt(__fd,0,0x2a,acStack_a8 + 8,0x88);
            if (-1 < iVar1) {
              return __fd;
            }
            __s = " ! Failed to join multicast group";
          }
        }
      }
    }
    perror(__s);
    close(__fd);
  }
  return -1;
}

Assistant:

int openSocket()
{
    static const uint32_t MdnsTTL = 255;

    int fd = socket(AF_INET, SOCK_DGRAM, 0);
    if (fd < 0) {
        perror("Creating socket failed");
        return -1;
    }

    uint32_t val = 1;

    int st = setsockopt(fd, SOL_SOCKET, SO_BROADCAST, &val, sizeof(val));
    if (st < 0) {
        perror("Setting SO_BROADCAST failed");
        close(fd);
        return -1;
    }
    st = setsockopt(fd, SOL_SOCKET, SO_REUSEADDR, &val, sizeof(val));
    if (st < 0) {
        perror("Setting SO_REUSEADDR failed");
        close(fd);
        return -1;
    }

    st = setsockopt(fd, IPPROTO_IP, IP_MULTICAST_TTL, &MdnsTTL, sizeof(MdnsTTL));
    if (st < 0) {
        perror("Setting ttl failed");
        close(fd);
        return -1;
    }

    struct sockaddr_in sin;
    memset(&sin, 0, sizeof(sin));
    sin.sin_family = AF_INET;
    sin.sin_port = htons(5353);
    sin.sin_addr.s_addr = INADDR_ANY;
    st = bind(fd, (const struct sockaddr *) &sin, sizeof(sin));
    if (st < 0) {
        perror("Falied to bind");
        close(fd);
        return -1;
    }

    struct group_req mgroup;
    bzero(&mgroup, sizeof mgroup);
    inet_aton("224.0.0.251", &sin.sin_addr);
    memcpy(&mgroup.gr_group, &sin, sizeof sin);

    st = setsockopt(fd, IPPROTO_IP, MCAST_JOIN_GROUP, reinterpret_cast<const char*>(&mgroup), sizeof(mgroup));
    if (st < 0) {
        perror(" ! Failed to join multicast group");
        close(fd);
        return -1;
    }

    return fd;
}